

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

void __thiscall DataRefs::UpdateXPSimTime(DataRefs *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  time_t unix_t;
  time_t now;
  tm tm_future;
  tm tm;
  long local_b0;
  long local_a8;
  tm local_a0;
  tm local_68;
  
  iVar1 = GetLocalDateDays(this);
  lVar4 = (long)iVar1 * 86400000;
  fVar7 = GetLocalTimeSec(this);
  lVar6 = (long)(fVar7 * 1000.0);
  fVar7 = GetZuluTimeSec(this);
  lVar5 = (long)(fVar7 * 1000.0);
  uVar2 = lVar6 - lVar5;
  uVar3 = -uVar2;
  if (0 < (long)uVar2) {
    uVar3 = uVar2;
  }
  if (60000 < uVar3) {
    if ((this->lastUsersPlanePos)._lon <= 0.0) {
      if (lVar5 < lVar6) {
        lVar4 = lVar4 + 86400000;
      }
    }
    else if (lVar6 < lVar5) {
      lVar4 = lVar4 + -86400000;
    }
  }
  time(&local_a8);
  gmtime_r(&local_a8,&local_68);
  lVar5 = (local_a8 -
          ((long)local_68.tm_sec + (long)local_68.tm_min * 0x3c +
          (long)(local_68.tm_hour * 0xe10) + (long)(local_68.tm_yday * 0x15180))) * 1000 + lVar4 +
          lVar5;
  lVar4 = lVar5;
  if (local_a8 * 1000 + 1000 < lVar5) {
    local_b0 = lVar5 / 1000;
    gmtime_r(&local_b0,&local_a0);
    local_b0 = (lVar5 + -0x757b12c00) / 1000;
    gmtime_r(&local_b0,&local_68);
    lVar4 = lVar5 + -0x75cd78800;
    if (local_68.tm_mday == local_a0.tm_mday) {
      lVar4 = lVar5 + -0x757b12c00;
    }
  }
  this->lastXPSimTime_ms = lVar4;
  return;
}

Assistant:

void DataRefs::UpdateXPSimTime()
{
    // convert all numbers right away to milliseconds as we need that in the end anyway
    // and that way we preserve the meaning of the fractional seconds coming from X-Plane
    constexpr long long DAY_MS = 24LL * 60LL * 60LL * 1000LL;
    long long t = (long long)(GetLocalDateDays()) * DAY_MS;
    const long long localTime = (long long)(GetLocalTimeSec() * 1000.0f);
    const long long zuluTime =  (long long)(GetZuluTimeSec()  * 1000.0f);
    // if local and zulu time are different at all (testing for more than one minute difference)
    if (std::llabs(localTime - zuluTime) > 60000LL) {
        // Eastern hemisphere? -> Zulu is _behind_ local time
        if (lastUsersPlanePos.lon() > 0.0) {
            // but if the local Zulu time component is actually _ahead of_ local time, then need to decrement zulu date
            if (zuluTime > localTime)
                t -= DAY_MS;
        } else {
            // Western hemisphere -> Zulu is _ahead of_ local time
            // but if the zulu time component is actually _behind_ local time, then need to increment zulu date
            if (zuluTime < localTime)
                t += DAY_MS;
        }
    }
    // Now t is date in zulu days, just add time component
    t += zuluTime;
    
    // Last thing to do: Add the beginning of the right year to it
    // Complications: X-Plane has no notion of a "year", it just returns days since start of the year
    //                X-Plane offers only 28 days for February, so it runs on a 365d year
    //                If the day of the year is past current real life day of year, then assume "last year"
    //                But: What do we do with leap years in reality???
    
    // Find this year's beginning
    time_t now;
    std::tm tm;
    time(&now);                     // today, actually 'now'
    gmtime_s(&tm, &now);
    // to get to jan01 of the same year reduce by all the days of the year and current time
    const time_t jan01 = now - tm.tm_yday * 24*60*60
                             - tm.tm_hour *    60*60
                             - tm.tm_min  *       60
                             - tm.tm_sec;
    
    // Convert to milliseconds, then add to our result
    t += (long long)(jan01) * 1000LL;
    
    // if t is now (more than 1s) in the future, then we reduce t by an entire year,
    // supposingly pointing to the same day last year
    if (t > (long long)(now+1) * 1000LL) {
        // Save a date representation of what we computed so far in the future
        time_t unix_t = time_t(t / 1000LL);
        std::tm tm_future;
        gmtime_s(&tm_future, &unix_t);
        
        // reduce by 365 days
        t -= 365LL * DAY_MS;
        
        // Would we need to skip over a leap year's 29th Feb?
        // Goal is: We need to end up on the same day of the month,
        //          so convert back to calendar days and let's check
        unix_t = time_t(t / 1000LL);
        gmtime_s(&tm, &unix_t);
        // If day of month don't agree then reduce by another day to cover leap day
        if (tm.tm_mday != tm_future.tm_mday)
            t -= DAY_MS;
    }
    
    // Done: store as our last calculate value
    lastXPSimTime_ms = (long long)t;
}